

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O3

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>::
~DeviceObjectBase(DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
                  *this)

{
  RenderDeviceVkImpl *pRVar1;
  IObject *pIVar2;
  IMemoryAllocator *pIVar3;
  char (*Args_1) [26];
  RefCountersImpl *this_00;
  string msg;
  string local_30;
  
  (this->super_ObjectBase<Diligent::IRenderPassVk>).super_RefCountedObject<Diligent::IRenderPassVk>.
  super_IRenderPassVk.super_IRenderPass.super_IDeviceObject.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_0091fcf8;
  pIVar3 = GetStringAllocator();
  Args_1 = (char (*) [26])pIVar3->_vptr_IMemoryAllocator;
  (**(_func_int **)(*Args_1 + 8))(pIVar3,(this->m_Desc).super_DeviceObjectAttribs.Name);
  if (this->m_bIsDeviceInternal == false) {
    pRVar1 = this->m_pDevice;
    this_00 = (pRVar1->
              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
              ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
              super_ObjectBase<Diligent::IRenderDeviceVk>.
              super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters;
    if (this_00 == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",Args_1);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"Release",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x229);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      this_00 = (pRVar1->
                super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.
                super_ObjectBase<Diligent::IRenderDeviceVk>.
                super_RefCountedObject<Diligent::IRenderDeviceVk>.m_pRefCounters;
    }
    RefCountersImpl::ReleaseStrongRef<Diligent::RefCountersImpl::ReleaseStrongRef()::_lambda()_1_>
              (this_00,(anon_class_1_0_00000001 *)&local_30);
  }
  pIVar2 = (this->m_pUserData).m_pObject;
  if (pIVar2 != (IObject *)0x0) {
    (*pIVar2->_vptr_IObject[2])();
    (this->m_pUserData).m_pObject = (IObject *)0x0;
  }
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }